

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O2

ExpressionSyntax * parseExpression(string *text)

{
  SourceManager *sourceManager;
  ExpressionSyntax *pEVar1;
  string_view name;
  string_view source;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  local_768;
  Parser parser;
  Preprocessor preprocessor;
  
  slang::SmallVectorBase<slang::Diagnostic>::clear
            ((SmallVectorBase<slang::Diagnostic> *)&slang::diagnostics);
  sourceManager = getSourceManager();
  parser.super_ParserBase.window.currentToken.info = (Info *)0x0;
  parser.super_ParserBase.window.lastConsumed.kind = Unknown;
  parser.super_ParserBase.window.lastConsumed._2_1_ = 0;
  parser.super_ParserBase.window.lastConsumed.numFlags.raw = '\0';
  parser.super_ParserBase.window.lastConsumed.rawLen = 0;
  parser.super_ParserBase.window.buffer = (Token *)0x0;
  parser.super_ParserBase.window.currentToken.kind = Unknown;
  parser.super_ParserBase.window.currentToken._2_1_ = 0;
  parser.super_ParserBase.window.currentToken.numFlags.raw = '\0';
  parser.super_ParserBase.window.currentToken.rawLen = 0;
  parser.super_ParserBase.alloc = (BumpAllocator *)0x0;
  parser.super_ParserBase.window.tokenSource = (Preprocessor *)0x0;
  boost::unordered::
  unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
              *)&parser);
  slang::parsing::Preprocessor::Preprocessor
            (&preprocessor,sourceManager,(BumpAllocator *)slang::alloc,
             (Diagnostics *)&slang::diagnostics,(Bag *)&parser,
             (span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>)
             ZEXT816(0));
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                 *)&parser);
  name._M_str = "source";
  name._M_len = 6;
  source._M_str = (text->_M_dataplus)._M_p;
  source._M_len = text->_M_string_length;
  slang::parsing::Preprocessor::pushSource(&preprocessor,source,name);
  local_768.size_ctrl.ml = 0;
  local_768.size_ctrl.size = 0;
  local_768.arrays.groups_ = (group_type_pointer)0x0;
  local_768.arrays.elements_ = (value_type_pointer)0x0;
  local_768.arrays.groups_size_index = 0;
  local_768.arrays.groups_size_mask = 0;
  boost::unordered::
  unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
              *)&local_768);
  slang::parsing::Parser::Parser(&parser,&preprocessor,(Bag *)&local_768);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core(&local_768);
  pEVar1 = slang::parsing::Parser::parseExpression(&parser);
  slang::parsing::Parser::~Parser(&parser);
  slang::parsing::Preprocessor::~Preprocessor(&preprocessor);
  return pEVar1;
}

Assistant:

const ExpressionSyntax& parseExpression(const std::string& text) {
    diagnostics.clear();

    Preprocessor preprocessor(getSourceManager(), alloc, diagnostics);
    preprocessor.pushSource(text);

    Parser parser(preprocessor);
    return parser.parseExpression();
}